

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptorProto::Swap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  MethodOptions *pMVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  
  if (other != this) {
    psVar3 = this->name_;
    this->name_ = other->name_;
    other->name_ = psVar3;
    psVar3 = this->input_type_;
    this->input_type_ = other->input_type_;
    other->input_type_ = psVar3;
    psVar3 = this->output_type_;
    this->output_type_ = other->output_type_;
    other->output_type_ = psVar3;
    pMVar4 = this->options_;
    this->options_ = other->options_;
    other->options_ = pMVar4;
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    pvVar5 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar5;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void MethodDescriptorProto::Swap(MethodDescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(input_type_, other->input_type_);
    std::swap(output_type_, other->output_type_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}